

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::ensureIntSpinBox(QInputDialogPrivate *this)

{
  QWidget *parent;
  QSpinBox *pQVar1;
  QWidget *this_00;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  code *local_60;
  ImplFn local_58;
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->intSpinBox == (QSpinBox *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    this_00 = (QWidget *)operator_new(0x28);
    QInputDialogSpinBox::QInputDialogSpinBox((QInputDialogSpinBox *)this_00,parent);
    this->intSpinBox = (QSpinBox *)this_00;
    QWidget::hide(this_00);
    pQVar1 = this->intSpinBox;
    local_60 = QInputDialog::intValueChanged;
    local_58 = (ImplFn)0x0;
    local_48 = QSpinBox::valueChanged;
    local_40 = 0;
    puVar2 = (undefined4 *)operator_new(0x20);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::QCallableObject<void_(QInputDialog::*)(int),_QtPrivate::List<int>,_void>::impl;
    *(code **)(puVar2 + 4) = QInputDialog::intValueChanged;
    *(undefined8 *)(puVar2 + 6) = 0;
    QObject::connectImpl
              (local_50,(void **)pQVar1,(QObject *)&local_48,(void **)parent,
               (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureIntSpinBox()
{
    Q_Q(QInputDialog);
    if (!intSpinBox) {
        intSpinBox = new QInputDialogSpinBox(q);
        intSpinBox->hide();
        QObject::connect(intSpinBox, &QInputDialogSpinBox::valueChanged,
                         q, &QInputDialog::intValueChanged);
    }
}